

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

string * bech32::Encode(string *__return_storage_ptr__,Encoding encoding,string *hrp,data *values)

{
  char *pcVar1;
  long lVar2;
  size_type sVar3;
  byte *pbVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  size_t i_1;
  long lVar7;
  byte bVar8;
  size_type sVar9;
  uint8_t *i;
  byte *pbVar10;
  data *__range1_1;
  string *__range1;
  long in_FS_OFFSET;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  allocator_type local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> enc;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = hrp->_M_string_length;
  sVar9 = 0;
  while (sVar3 != sVar9) {
    pcVar1 = (hrp->_M_dataplus)._M_p + sVar9;
    sVar9 = sVar9 + 1;
    if (0xe5 < (byte)(*pcVar1 + 0xa5U)) {
      __assert_fail("c < \'A\' || c > \'Z\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bech32.cpp"
                    ,0x16a,"std::string bech32::Encode(Encoding, const std::string &, const data &)"
                   );
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             (size_type)
             ((values->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish +
             (sVar3 - (long)(values->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start) + 7));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,hrp);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (__return_storage_ptr__,'1');
  pbVar4 = (values->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pbVar10 = (values->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start; pbVar10 != pbVar4; pbVar10 = pbVar10 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,"qpzry9x8gf2tvdw0s3jn54khce6mua7l"[*pbVar10]);
  }
  anon_unknown_0::PreparePolynomialCoefficients(&enc,hrp,values);
  local_51 = (allocator_type)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (&enc,(const_iterator)
                  enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish,6,(value_type_conflict *)&local_51);
  uVar5 = anon_unknown_0::PolyMod(&enc);
  uVar6 = anon_unknown_0::EncodingConstant(encoding);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,6,&local_51);
  bVar8 = 0x19;
  for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
    local_70._M_impl.super__Vector_impl_data._M_start[lVar7] =
         (byte)((uVar6 ^ uVar5) >> (bVar8 & 0x1f)) & 0x1f;
    bVar8 = bVar8 - 5;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  for (pbVar10 = local_70._M_impl.super__Vector_impl_data._M_start;
      pbVar10 != local_70._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,"qpzry9x8gf2tvdw0s3jn54khce6mua7l"[*pbVar10]);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string Encode(Encoding encoding, const std::string& hrp, const data& values) {
    // First ensure that the HRP is all lowercase. BIP-173 and BIP350 require an encoder
    // to return a lowercase Bech32/Bech32m string, but if given an uppercase HRP, the
    // result will always be invalid.
    for (const char& c : hrp) assert(c < 'A' || c > 'Z');

    std::string ret;
    ret.reserve(hrp.size() + 1 + values.size() + CHECKSUM_SIZE);
    ret += hrp;
    ret += '1';
    for (const uint8_t& i : values) ret += CHARSET[i];
    for (const uint8_t& i : CreateChecksum(encoding, hrp, values)) ret += CHARSET[i];
    return ret;
}